

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O1

void __thiscall
Diligent::QueryBase<Diligent::EngineGLImplTraits>::CheckQueryDataPtr
          (QueryBase<Diligent::EngineGLImplTraits> *this,void *pData,Uint32 DataSize)

{
  char (*in_R8) [27];
  string msg;
  undefined4 in_stack_ffffffffffffffb8;
  string local_40;
  char local_20 [8];
  
  if (this->m_State != Ended) {
    FormatString<char[34],char_const*,char[27]>
              (&local_40,(Diligent *)"Attempting to get data of query \'",
               (char (*) [34])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' that has not been ended.",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0xac);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (pData != (void *)0x0) {
    if (*pData != (this->
                  super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                  ).m_Desc.Type) {
      FormatString<char[37]>(&local_40,(char (*) [37])"Incorrect query data structure type.");
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    switch((this->
           super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
           ).m_Desc.Type) {
    case QUERY_TYPE_UNDEFINED:
      FormatString<char[36]>(&local_40,(char (*) [36])"Undefined query type is unexpected.");
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xb6);
      break;
    case QUERY_TYPE_OCCLUSION:
      if (DataSize == 0x10) {
        return;
      }
      local_20[0] = '\x10';
      local_20[1] = '\0';
      local_20[2] = '\0';
      local_20[3] = '\0';
      local_20[4] = '\0';
      local_20[5] = '\0';
      local_20[6] = '\0';
      local_20[7] = '\0';
      FormatString<char[25],unsigned_int,char[17],unsigned_long,char[47]>
                (&local_40,(Diligent *)"The size of query data (",
                 (char (*) [25])&stack0xffffffffffffffbc,(uint *)") is incorrect: ",
                 (char (*) [17])local_20,
                 (unsigned_long *)" (aka sizeof(QueryDataOcclusion)) is expected.",
                 (char (*) [47])CONCAT44(DataSize,in_stack_ffffffffffffffb8));
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xbb);
      break;
    case QUERY_TYPE_BINARY_OCCLUSION:
      if (DataSize == 8) {
        return;
      }
      local_20[0] = '\b';
      local_20[1] = '\0';
      local_20[2] = '\0';
      local_20[3] = '\0';
      local_20[4] = '\0';
      local_20[5] = '\0';
      local_20[6] = '\0';
      local_20[7] = '\0';
      FormatString<char[25],unsigned_int,char[17],unsigned_long,char[53]>
                (&local_40,(Diligent *)"The size of query data (",
                 (char (*) [25])&stack0xffffffffffffffbc,(uint *)") is incorrect: ",
                 (char (*) [17])local_20,
                 (unsigned_long *)" (aka sizeof(QueryDataBinaryOcclusion)) is expected.",
                 (char (*) [53])CONCAT44(DataSize,in_stack_ffffffffffffffb8));
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xc0);
      break;
    case QUERY_TYPE_TIMESTAMP:
      if (DataSize == 0x18) {
        return;
      }
      local_20[0] = '\x18';
      local_20[1] = '\0';
      local_20[2] = '\0';
      local_20[3] = '\0';
      local_20[4] = '\0';
      local_20[5] = '\0';
      local_20[6] = '\0';
      local_20[7] = '\0';
      FormatString<char[25],unsigned_int,char[17],unsigned_long,char[47]>
                (&local_40,(Diligent *)"The size of query data (",
                 (char (*) [25])&stack0xffffffffffffffbc,(uint *)") is incorrect: ",
                 (char (*) [17])local_20,
                 (unsigned_long *)" (aka sizeof(QueryDataTimestamp)) is expected.",
                 (char (*) [47])CONCAT44(DataSize,in_stack_ffffffffffffffb8));
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xc5);
      break;
    case QUERY_TYPE_PIPELINE_STATISTICS:
      if (DataSize == 0x60) {
        return;
      }
      local_20[0] = '`';
      local_20[1] = '\0';
      local_20[2] = '\0';
      local_20[3] = '\0';
      local_20[4] = '\0';
      local_20[5] = '\0';
      local_20[6] = '\0';
      local_20[7] = '\0';
      FormatString<char[25],unsigned_int,char[17],unsigned_long,char[56]>
                (&local_40,(Diligent *)"The size of query data (",
                 (char (*) [25])&stack0xffffffffffffffbc,(uint *)") is incorrect: ",
                 (char (*) [17])local_20,
                 (unsigned_long *)" (aka sizeof(QueryDataPipelineStatistics)) is expected.",
                 (char (*) [56])CONCAT44(DataSize,in_stack_ffffffffffffffb8));
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xca);
      break;
    case QUERY_TYPE_DURATION:
      if (DataSize == 0x18) {
        return;
      }
      local_20[0] = '\x18';
      local_20[1] = '\0';
      local_20[2] = '\0';
      local_20[3] = '\0';
      local_20[4] = '\0';
      local_20[5] = '\0';
      local_20[6] = '\0';
      local_20[7] = '\0';
      FormatString<char[25],unsigned_int,char[17],unsigned_long,char[46]>
                (&local_40,(Diligent *)"The size of query data (",
                 (char (*) [25])&stack0xffffffffffffffbc,(uint *)") is incorrect: ",
                 (char (*) [17])local_20,
                 (unsigned_long *)" (aka sizeof(QueryDataDuration)) is expected.",
                 (char (*) [46])CONCAT44(DataSize,in_stack_ffffffffffffffb8));
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xcf);
      break;
    default:
      FormatString<char[23]>(&local_40,(char (*) [23])"Unexpected query type.");
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xd3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CheckQueryDataPtr(void* pData, Uint32 DataSize)
    {
        DEV_CHECK_ERR(m_State == QueryState::Ended,
                      "Attempting to get data of query '", this->m_Desc.Name, "' that has not been ended.");

        if (pData != nullptr)
        {
            DEV_CHECK_ERR(*reinterpret_cast<QUERY_TYPE*>(pData) == this->m_Desc.Type, "Incorrect query data structure type.");

            static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below.");
            switch (this->m_Desc.Type)
            {
                case QUERY_TYPE_UNDEFINED:
                    UNEXPECTED("Undefined query type is unexpected.");
                    break;

                case QUERY_TYPE_OCCLUSION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataOcclusion),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataOcclusion), " (aka sizeof(QueryDataOcclusion)) is expected.");
                    break;

                case QUERY_TYPE_BINARY_OCCLUSION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataBinaryOcclusion),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataBinaryOcclusion), " (aka sizeof(QueryDataBinaryOcclusion)) is expected.");
                    break;

                case QUERY_TYPE_TIMESTAMP:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataTimestamp),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataTimestamp), " (aka sizeof(QueryDataTimestamp)) is expected.");
                    break;

                case QUERY_TYPE_PIPELINE_STATISTICS:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataPipelineStatistics),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataPipelineStatistics), " (aka sizeof(QueryDataPipelineStatistics)) is expected.");
                    break;

                case QUERY_TYPE_DURATION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataDuration),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataDuration), " (aka sizeof(QueryDataDuration)) is expected.");
                    break;

                default:
                    UNEXPECTED("Unexpected query type.");
            }
        }
    }